

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

bool __thiscall
perfetto::protos::gen::QueryCapabilitiesResponse::ParseFromArray
          (QueryCapabilitiesResponse *this,void *raw,size_t size)

{
  byte bVar1;
  _Head_base<0UL,_perfetto::protos::gen::TracingServiceCapabilities_*,_false> _Var2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  ulong *puVar6;
  ulong uVar7;
  bool bVar8;
  ulong *puVar9;
  ulong uVar10;
  ulong uVar11;
  ulong *puVar12;
  ulong *puVar13;
  ulong uVar14;
  uint uVar15;
  ulong *in_R11;
  ulong *puVar16;
  bool bVar17;
  ulong local_58;
  Field local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  local_38 = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar6 = (ulong *)(size + (long)raw);
  do {
    lVar4 = 7;
    if (puVar6 <= raw) goto LAB_0026356c;
    uVar11 = (ulong)(char)(byte)*raw;
    puVar16 = (ulong *)((long)raw + 1);
    if ((long)uVar11 < 0) {
      bVar1 = (byte)*raw;
      uVar3 = (ulong)(bVar1 & 0x7f);
      bVar8 = false;
      puVar9 = puVar16;
      for (; (uVar11 = uVar3, puVar12 = puVar9, (char)bVar1 < '\0' &&
             (bVar17 = 0x38 < lVar4 - 7U, bVar8 = bVar17 || puVar6 <= puVar9, uVar11 = 0,
             puVar12 = puVar16, !bVar17 && puVar6 > puVar9)); lVar4 = lVar4 + 7) {
        bVar1 = (byte)*puVar9;
        in_R11 = (ulong *)((ulong)(bVar1 & 0x7f) << ((byte)lVar4 & 0x3f));
        puVar9 = (ulong *)((long)puVar9 + 1);
        uVar3 = uVar3 | (ulong)in_R11;
      }
      puVar16 = puVar12;
      if (bVar8) {
        puVar16 = (ulong *)raw;
        uVar11 = 0;
      }
      if (puVar16 == (ulong *)raw) goto LAB_0026356c;
    }
    uVar5 = (uint)(uVar11 >> 3);
    if ((uVar5 == 0) || (puVar6 <= puVar16)) {
switchD_002633e6_caseD_3:
      bVar8 = false;
      uVar11 = 0;
      uVar3 = 0;
    }
    else {
      switch((uint)uVar11 & 7) {
      case 0:
        uVar10 = 0;
        bVar8 = puVar16 >= puVar6;
        if (puVar16 < puVar6) {
          puVar9 = (ulong *)((long)puVar16 + 1);
          bVar1 = (byte)*puVar16;
          uVar7 = (ulong)(bVar1 & 0x7f);
          uVar3 = 0;
          uVar14 = uVar7;
          if ((char)bVar1 < '\0') {
            uVar14 = 0;
          }
          uVar15 = (uint)uVar14;
          in_R11 = puVar9;
          if ((char)bVar1 < '\0') {
            uVar3 = 0;
            lVar4 = 7;
            puVar12 = puVar9;
            do {
              uVar15 = (uint)uVar14;
              bVar8 = 0x38 < lVar4 - 7U || puVar6 <= puVar12;
              in_R11 = puVar9;
              if (bVar8) break;
              bVar1 = (byte)*puVar12;
              in_R11 = (ulong *)((long)puVar12 + 1);
              uVar7 = uVar7 | (ulong)(bVar1 & 0x7f) << ((byte)lVar4 & 0x3f);
              lVar4 = lVar4 + 7;
              if ((char)bVar1 >= '\0') {
                uVar14 = uVar7 & 0xffffffff;
                uVar3 = uVar7 >> 0x20;
              }
              uVar15 = (uint)uVar14;
              puVar12 = in_R11;
            } while ((char)bVar1 < '\0');
          }
        }
        else {
          uVar3 = 0;
          uVar15 = 0;
        }
        if (bVar8) {
          uVar3 = 0;
          in_R11 = puVar16;
          uVar15 = 0;
        }
        if (in_R11 != puVar16) goto LAB_0026359f;
        uVar11 = 0;
        bVar8 = false;
        uVar3 = uVar10;
        goto LAB_002635e0;
      case 1:
        in_R11 = puVar16 + 1;
        if (puVar6 < in_R11) {
LAB_0026356c:
          uVar11 = 0;
          bVar8 = false;
          uVar3 = 0;
          goto LAB_002635e0;
        }
        uVar10 = *puVar16;
        uVar3 = uVar10 >> 0x20;
        break;
      case 2:
        bVar8 = puVar16 >= puVar6;
        uVar10 = local_58;
        if (puVar16 < puVar6) {
          puVar9 = (ulong *)((long)puVar16 + 1);
          uVar3 = (ulong)((byte)*puVar16 & 0x7f);
          in_R11 = puVar9;
          uVar10 = uVar3;
          if ((char)(byte)*puVar16 < '\0') {
            lVar4 = 7;
            puVar12 = puVar9;
            do {
              bVar8 = 0x38 < lVar4 - 7U || puVar6 <= puVar12;
              in_R11 = puVar9;
              uVar10 = local_58;
              if (bVar8) break;
              uVar14 = *puVar12;
              puVar12 = (ulong *)((long)puVar12 + 1);
              uVar3 = uVar3 | (ulong)((byte)uVar14 & 0x7f) << ((byte)lVar4 & 0x3f);
              lVar4 = lVar4 + 7;
              in_R11 = puVar12;
              uVar10 = uVar3;
            } while ((char)(byte)uVar14 < '\0');
          }
        }
        uVar3 = 0;
        local_58 = uVar10;
        if (bVar8) {
          in_R11 = puVar16;
          local_58 = uVar3;
        }
        if (in_R11 == puVar16) {
          uVar15 = 0;
          bVar8 = false;
          uVar10 = 0;
        }
        else if ((ulong)((long)puVar6 - (long)in_R11) < local_58) {
          uVar3 = 0;
          uVar15 = 0;
          bVar8 = false;
          uVar10 = 0;
        }
        else {
          uVar3 = (ulong)in_R11 >> 0x20;
          uVar15 = (uint)in_R11;
          in_R11 = (ulong *)((long)in_R11 + local_58);
          bVar8 = true;
          uVar10 = local_58;
        }
        if (!bVar8) goto LAB_0026356c;
        goto LAB_0026359f;
      default:
        goto switchD_002633e6_caseD_3;
      case 5:
        in_R11 = (ulong *)((long)puVar16 + 4);
        uVar3 = 0;
        if (puVar6 < in_R11) goto LAB_0026356c;
        uVar10 = (ulong)(uint)*puVar16;
      }
      uVar15 = (uint)uVar10;
      uVar10 = 0;
LAB_0026359f:
      bVar8 = true;
      raw = in_R11;
      if ((uVar5 < 0x10000) && (uVar10 < 0x10000000)) {
        uVar3 = (ulong)uVar15 | uVar3 << 0x20;
        uVar11 = uVar10 | (uVar11 >> 3) << 0x20 | (uVar11 & 7) << 0x30;
        bVar8 = false;
      }
      else {
        uVar3 = 0;
        uVar11 = 0;
      }
    }
LAB_002635e0:
    puVar16 = (ulong *)0x7;
    local_48.int_value_ = uVar3;
    if (!bVar8) {
      do {
        local_48.size_ = (uint32_t)uVar11;
        local_48.type_ = (uint8_t)(uVar11 >> 0x30);
        local_48.id_ = (uint16_t)(uVar11 >> 0x20);
        if (local_48.id_ == 1) {
          *(byte *)&(this->_has_field_).super__Base_bitset<1UL>._M_w =
               (byte)(this->_has_field_).super__Base_bitset<1UL>._M_w | 2;
          _Var2._M_head_impl =
               (this->capabilities_).ptr_._M_t.
               super___uniq_ptr_impl<perfetto::protos::gen::TracingServiceCapabilities,_std::default_delete<perfetto::protos::gen::TracingServiceCapabilities>_>
               ._M_t.
               super__Tuple_impl<0UL,_perfetto::protos::gen::TracingServiceCapabilities_*,_std::default_delete<perfetto::protos::gen::TracingServiceCapabilities>_>
               .super__Head_base<0UL,_perfetto::protos::gen::TracingServiceCapabilities_*,_false>.
               _M_head_impl;
          (**(code **)(*(long *)&(_Var2._M_head_impl)->super_CppMessageObj + 0x20))
                    (_Var2._M_head_impl,local_48.int_value_,uVar11 & 0xffffffff);
        }
        else {
          if (local_48.id_ == 0) {
            return puVar6 == (ulong *)raw;
          }
          protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_48,local_38);
        }
        do {
          if (puVar6 <= raw) goto LAB_00263781;
          uVar11 = (ulong)(char)(byte)*raw;
          puVar9 = (ulong *)((long)raw + 1);
          if ((long)uVar11 < 0) {
            uVar11 = (ulong)((byte)*raw & 0x7f);
            bVar8 = false;
            puVar12 = puVar9;
            if ((char)(byte)*raw < '\0') {
              lVar4 = 7;
              uVar10 = uVar11;
              puVar13 = puVar9;
              do {
                bVar8 = 0x38 < lVar4 - 7U || puVar6 <= puVar13;
                uVar11 = 0;
                puVar12 = puVar9;
                if (bVar8) break;
                uVar14 = *puVar13;
                puVar12 = (ulong *)((long)puVar13 + 1);
                uVar11 = uVar10 | (ulong)((byte)uVar14 & 0x7f) << ((byte)lVar4 & 0x3f);
                lVar4 = lVar4 + 7;
                uVar10 = uVar11;
                puVar13 = puVar12;
              } while ((char)(byte)uVar14 < '\0');
            }
            puVar9 = puVar12;
            if (bVar8) {
              puVar9 = (ulong *)raw;
              uVar11 = 0;
            }
            if (puVar9 == (ulong *)raw) goto LAB_00263781;
          }
          uVar5 = (uint)(uVar11 >> 3);
          if ((uVar5 == 0) || (puVar6 <= puVar9)) {
switchD_00263809_caseD_3:
            local_48.int_value_ = 0;
            bVar8 = false;
            uVar11 = 0;
            goto LAB_002639f9;
          }
          switch((uint)uVar11 & 7) {
          case 0:
            local_48.int_value_ = 0;
            bVar8 = puVar9 >= puVar6;
            if (puVar9 < puVar6) {
              puVar12 = (ulong *)((long)puVar9 + 1);
              uVar15 = (byte)*puVar9 & 0x7f;
              uVar10 = (ulong)uVar15;
              uVar14 = (ulong)uVar15;
              puVar16 = puVar12;
              uVar15 = 0;
              if ((char)(byte)*puVar9 < '\0') {
                uVar14 = 0;
                lVar4 = 7;
                puVar13 = puVar12;
                do {
                  bVar17 = 0x38 < lVar4 - 7U;
                  bVar8 = bVar17 || puVar6 <= puVar13;
                  puVar16 = puVar12;
                  uVar15 = 0;
                  if (bVar17 || puVar6 <= puVar13) break;
                  bVar1 = (byte)*puVar13;
                  puVar13 = (ulong *)((long)puVar13 + 1);
                  uVar10 = uVar10 | (ulong)(bVar1 & 0x7f) << ((byte)lVar4 & 0x3f);
                  lVar4 = lVar4 + 7;
                  if (-1 < (char)bVar1) {
                    uVar14 = uVar10 & 0xffffffff;
                  }
                  puVar16 = puVar13;
                  uVar15 = (uint)(uVar10 >> 0x20);
                } while (-1 >= (char)bVar1);
              }
            }
            else {
              uVar14 = 0;
              uVar15 = 0;
            }
            if (bVar8) {
              uVar14 = local_48.int_value_;
            }
            uVar10 = (ulong)uVar15;
            if (bVar8) {
              puVar16 = puVar9;
              uVar10 = local_48.int_value_;
            }
            uVar7 = local_48.int_value_;
            if (puVar16 == puVar9) {
              uVar11 = 0;
              bVar8 = false;
            }
            else {
LAB_002639b8:
              bVar8 = true;
              raw = puVar16;
              if ((uVar5 < 0x10000) && (uVar7 < 0x10000000)) {
                local_48.int_value_ = uVar14 & 0xffffffff | uVar10 << 0x20;
                uVar11 = uVar7 | (uVar11 >> 3) << 0x20 | (uVar11 & 7) << 0x30;
                bVar8 = false;
              }
              else {
                local_48.int_value_ = 0;
                uVar11 = 0;
              }
            }
            break;
          case 1:
            puVar16 = puVar9 + 1;
            if (puVar16 <= puVar6) {
              uVar14 = *puVar9;
              uVar10 = uVar14 >> 0x20;
LAB_0026386a:
              uVar7 = 0;
              goto LAB_002639b8;
            }
            goto LAB_00263781;
          case 2:
            bVar8 = puVar9 >= puVar6;
            uVar10 = uVar3;
            if (puVar9 < puVar6) {
              puVar12 = (ulong *)((long)puVar9 + 1);
              uVar14 = (ulong)((byte)*puVar9 & 0x7f);
              puVar16 = puVar12;
              uVar10 = uVar14;
              if ((char)(byte)*puVar9 < '\0') {
                lVar4 = 7;
                puVar13 = puVar12;
                do {
                  bVar8 = 0x38 < lVar4 - 7U || puVar6 <= puVar13;
                  puVar16 = puVar12;
                  uVar10 = uVar3;
                  if (bVar8) break;
                  uVar7 = *puVar13;
                  puVar13 = (ulong *)((long)puVar13 + 1);
                  uVar14 = uVar14 | (ulong)((byte)uVar7 & 0x7f) << ((byte)lVar4 & 0x3f);
                  lVar4 = lVar4 + 7;
                  puVar16 = puVar13;
                  uVar10 = uVar14;
                } while ((char)(byte)uVar7 < '\0');
              }
            }
            uVar3 = uVar10;
            if (bVar8) {
              puVar16 = puVar9;
              uVar3 = 0;
            }
            if ((puVar16 == puVar9) || ((ulong)((long)puVar6 - (long)puVar16) < uVar3)) {
              uVar14 = 0;
              uVar10 = 0;
              bVar8 = false;
              uVar7 = 0;
            }
            else {
              uVar10 = (ulong)puVar16 >> 0x20;
              uVar14 = (ulong)puVar16 & 0xffffffff;
              puVar16 = (ulong *)((long)puVar16 + uVar3);
              bVar8 = true;
              uVar7 = uVar3;
            }
            if (bVar8) goto LAB_002639b8;
            local_48.int_value_ = 0;
            uVar11 = 0;
            bVar8 = false;
            break;
          default:
            goto switchD_00263809_caseD_3;
          case 5:
            puVar16 = (ulong *)((long)puVar9 + 4);
            uVar10 = 0;
            if (puVar16 <= puVar6) {
              uVar14 = (ulong)(uint)*puVar9;
              goto LAB_0026386a;
            }
LAB_00263781:
            local_48.int_value_ = 0;
            uVar11 = 0;
            bVar8 = false;
          }
LAB_002639f9:
        } while (bVar8);
      } while( true );
    }
  } while( true );
}

Assistant:

bool QueryCapabilitiesResponse::ParseFromArray(const void* raw, size_t size) {
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* capabilities */:
        (*capabilities_).ParseFromArray(field.data(), field.size());
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}